

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

ParseLocationRange __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocationRange
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  _Base_ptr p_Var1;
  ParseLocation PVar2;
  int iVar3;
  _Base_ptr p_Var4;
  ParseLocation PVar6;
  _Rb_tree_header *p_Var7;
  ParseLocationRange PVar8;
  long lVar5;
  
  CheckFieldIndex(field,index);
  p_Var4 = (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  PVar6.line = -1;
  PVar6.column = -1;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var7 = &(this->locations_)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var7->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var4 + 1) >= field) {
        p_Var1 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(FieldDescriptor **)(p_Var4 + 1) < field];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var7) && (*(FieldDescriptor **)(p_Var1 + 1) <= field)) {
      iVar3 = 0;
      if (index != -1) {
        iVar3 = index;
      }
      lVar5 = (long)iVar3;
      p_Var4 = p_Var1[1]._M_parent;
      PVar2.line = -1;
      PVar2.column = -1;
      if (lVar5 < (long)p_Var1[1]._M_left - (long)p_Var4 >> 4) {
        PVar2 = *(ParseLocation *)(&p_Var4->_M_color + lVar5 * 4);
        PVar6 = *(ParseLocation *)(&p_Var4->_M_parent + lVar5 * 2);
      }
      goto LAB_003ada8a;
    }
  }
  PVar2.line = -1;
  PVar2.column = -1;
LAB_003ada8a:
  PVar8.end = PVar6;
  PVar8.start = PVar2;
  return PVar8;
}

Assistant:

TextFormat::ParseLocationRange TextFormat::ParseInfoTree::GetLocationRange(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  const std::vector<TextFormat::ParseLocationRange>* locations =
      FindOrNull(locations_, field);
  if (locations == nullptr ||
      index >= static_cast<int64_t>(locations->size())) {
    return TextFormat::ParseLocationRange();
  }

  return (*locations)[index];
}